

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimedatabase.cpp
# Opt level: O3

QStringList * __thiscall
QMimeDatabasePrivate::mimeTypeForFileName
          (QStringList *__return_storage_ptr__,QMimeDatabasePrivate *this,QString *fileName)

{
  bool bVar1;
  QString *data;
  QString *pQVar2;
  long in_FS_OFFSET;
  QMimeGlobMatchResult result;
  undefined1 local_78 [56];
  undefined1 *puStack_40;
  undefined1 *local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QString::endsWith(fileName,(QChar)0x2f,CaseSensitive);
  if (bVar1) {
    local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pQVar2 = (QString *)QArrayData::allocate((QArrayData **)local_78,0x18,0x10,1,KeepSize);
    (__return_storage_ptr__->d).d = (Data *)local_78._0_8_;
    (__return_storage_ptr__->d).ptr = pQVar2;
    (pQVar2->d).d = (Data *)0x0;
    (pQVar2->d).ptr = L"inode/directory";
    (pQVar2->d).size = 0xf;
    (__return_storage_ptr__->d).size = 1;
  }
  else {
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_78._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_78._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    findByFileName((QMimeGlobMatchResult *)local_78,this,fileName);
    (__return_storage_ptr__->d).d = (Data *)local_78._0_8_;
    (__return_storage_ptr__->d).ptr = (QString *)local_78._8_8_;
    (__return_storage_ptr__->d).size = local_78._16_8_;
    if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_78._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_78._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QtPrivate::QStringList_sort(__return_storage_ptr__,CaseSensitive);
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)(local_78 + 0x18));
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_78);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QMimeDatabasePrivate::mimeTypeForFileName(const QString &fileName)
{
    if (fileName.endsWith(u'/'))
        return { directoryMimeType() };

    const QMimeGlobMatchResult result = findByFileName(fileName);
    QStringList matchingMimeTypes = result.m_matchingMimeTypes;
    matchingMimeTypes.sort(); // make it deterministic
    return matchingMimeTypes;
}